

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O0

size_t __thiscall pcplusplus::threads::generic_threads::join(generic_threads *this)

{
  long in_RDI;
  system_error *e;
  size_t i;
  size_t in_stack_ffffffffffffff78;
  unique_ptr<std::thread[],_std::default_delete<std::thread[]>_> *in_stack_ffffffffffffff80;
  undefined8 local_10;
  
  for (local_10 = 0; local_10 < *(ulong *)(in_RDI + 0x40); local_10 = local_10 + 1) {
    std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::operator[]
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::thread::join();
  }
  return *(size_t *)(in_RDI + 0x50);
}

Assistant:

virtual inline size_t join(){
		try{
		    for(size_t i = 0; i < num_threads; ++i)
			threads[i].join();
		}
		catch(const std::system_error& e){
		    throw exceptions::thread_failure("Failed to fork a " + thread_type + " thread.");
		}
		return num_processed;
	    }